

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O2

DUMB_CLICK * dumb_click_mergesort(DUMB_CLICK *click,int n_clicks)

{
  int iVar1;
  DUMB_CLICK *pDVar2;
  DUMB_CLICK *pDVar3;
  DUMB_CLICK *pDVar4;
  DUMB_CLICK *pDVar5;
  DUMB_CLICK *c1;
  undefined1 local_28 [16];
  
  local_28._8_8_ = click;
  if (1 < n_clicks) {
    local_28._0_8_ = click;
    pDVar3 = (DUMB_CLICK *)local_28;
    for (iVar1 = 0; pDVar5 = pDVar3->next, iVar1 < n_clicks; iVar1 = iVar1 + 2) {
      pDVar3 = pDVar5;
    }
    pDVar3->next = (DUMB_CLICK *)0x0;
    pDVar2 = dumb_click_mergesort((DUMB_CLICK *)local_28._0_8_,n_clicks + 1U >> 1);
    local_28._0_8_ = pDVar2;
    pDVar3 = dumb_click_mergesort(pDVar5,(uint)n_clicks >> 1);
    pDVar5 = (DUMB_CLICK *)(local_28 + 8);
    while ((pDVar4 = pDVar3, pDVar2 != (DUMB_CLICK *)0x0 && (pDVar4 != (DUMB_CLICK *)0x0))) {
      if (pDVar4->pos < pDVar2->pos) {
        pDVar5->next = pDVar4;
        pDVar3 = pDVar4->next;
        pDVar5 = pDVar4;
      }
      else {
        pDVar5->next = pDVar2;
        pDVar3 = pDVar4;
        pDVar5 = pDVar2;
        pDVar2 = pDVar2->next;
      }
    }
    if (pDVar4 != (DUMB_CLICK *)0x0) {
      pDVar2 = pDVar4;
    }
    pDVar5->next = pDVar2;
    click = (DUMB_CLICK *)local_28._8_8_;
  }
  return click;
}

Assistant:

static DUMB_CLICK *dumb_click_mergesort(DUMB_CLICK *click, int n_clicks)
{
	int i;
	DUMB_CLICK *c1, *c2, **cp;

	if (n_clicks <= 1) return click;

	/* Split the list into two */
	c1 = click;
	cp = &c1;
	for (i = 0; i < n_clicks; i += 2) cp = &(*cp)->next;
	c2 = *cp;
	*cp = NULL;

	/* Sort the sublists */
	c1 = dumb_click_mergesort(c1, (n_clicks + 1) >> 1);
	c2 = dumb_click_mergesort(c2, n_clicks >> 1);

	/* Merge them */
	cp = &click;
	while (c1 && c2) {
		if (c1->pos > c2->pos) {
			*cp = c2;
			c2 = c2->next;
		} else {
			*cp = c1;
			c1 = c1->next;
		}
		cp = &(*cp)->next;
	}
	if (c2)
		*cp = c2;
	else
		*cp = c1;

	return click;
}